

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_temporary.h
# Opt level: O3

void __thiscall
sc_core::sc_vpool<sc_dt::sc_concatref>::sc_vpool
          (sc_vpool<sc_dt::sc_concatref> *this,int log2,sc_concatref *pool_p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  sc_concatref *psVar5;
  ulong uVar6;
  
  this->m_pool_i = 0;
  if (pool_p == (sc_concatref *)0x0) {
    uVar6 = 1L << ((byte)log2 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar2 = SUB168(auVar1 * ZEXT816(0x28),0);
    uVar3 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar2 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x28),8) == 0) {
      uVar2 = uVar3;
    }
    puVar4 = (ulong *)operator_new__(uVar2);
    *puVar4 = uVar6;
    pool_p = (sc_concatref *)(puVar4 + 1);
    psVar5 = pool_p;
    do {
      (psVar5->super_sc_value_base)._vptr_sc_value_base =
           (_func_int **)&PTR_concat_clear_data_0026c8f8;
      psVar5->m_left_p = (sc_value_base *)0x0;
      psVar5->m_right_p = (sc_value_base *)0x0;
      *(undefined8 *)((long)&psVar5->m_right_p + 4) = 0;
      psVar5->m_len_r = 0;
      psVar5->m_flags = cf_none;
      psVar5 = psVar5 + 1;
    } while (psVar5 != (sc_concatref *)(puVar4 + uVar6 * 5 + 1));
  }
  this->m_pool_p = pool_p;
  this->m_wrap = ~(-1L << ((byte)log2 & 0x3f));
  return;
}

Assistant:

sc_vpool<T>::sc_vpool( int log2, T* pool_p )
  : m_pool_i( 0 )
  , m_pool_p( pool_p ? pool_p : new T[static_cast<std::size_t>(1) << log2] )
  , m_wrap( ~(static_cast<std::size_t>(-1) << log2) )
{
	// if ( log2 > 32 ) SC_REPORT_ERROR(SC_ID_POOL_SIZE_, "");
}